

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O3

int __thiscall cali::util::Args::ArgsImpl::parse(ArgsImpl *this,int argc,char **argv,int pos)

{
  uint uVar1;
  char cVar2;
  undefined1 uVar3;
  char *pcVar4;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  int iVar5;
  long lVar6;
  iterator iVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  int iVar10;
  char *pcVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  _Base_ptr *__args;
  string optarg;
  string arg;
  int local_f0;
  allocator<char> local_e9;
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  undefined1 local_98 [24];
  _Base_ptr local_80;
  ArgsImpl *local_78;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_70;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
  *local_68;
  ulong local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_48;
  ulong local_40;
  ulong local_38;
  
  iVar5 = pos;
  if (pos < argc) {
    pcVar4 = *argv;
    pcVar11 = (char *)(this->m_programname)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&this->m_programname,0,pcVar11,(ulong)pcVar4);
    local_48 = &this->m_long_options;
    local_50 = &(this->m_long_options)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                *)&this->m_active_options;
    local_58 = &(this->m_short_options)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_70 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->m_arguments;
    local_80 = (_Base_ptr)argv;
    local_78 = this;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,*(char **)(&local_80->_M_color + (long)pos * 2),
                 (allocator<char> *)local_a8);
      local_f0 = 4;
      if (local_c8._M_string_length != 0) {
        if ((local_c8._M_string_length == (this->m_options_end)._M_string_length) &&
           (iVar5 = bcmp(local_c8._M_dataplus._M_p,(this->m_options_end)._M_dataplus._M_p,
                         local_c8._M_string_length), iVar5 == 0)) {
          local_f0 = 2;
        }
        else if (((this->m_longopt_prefix)._M_string_length == 0) ||
                (lVar6 = std::__cxx11::string::find
                                   ((char *)&local_c8,
                                    (ulong)(this->m_longopt_prefix)._M_dataplus._M_p,0), lVar6 != 0)
                ) {
          uVar13 = (this->m_shortopt_prefix)._M_string_length;
          if ((uVar13 == 0) ||
             (lVar6 = std::__cxx11::string::find
                                ((char *)&local_c8,(ulong)(this->m_shortopt_prefix)._M_dataplus._M_p
                                 ,0), lVar6 != 0)) {
            local_f0 = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>(local_70,&local_c8);
          }
          else {
            uVar8 = std::__cxx11::string::find((char)&local_c8,0x3d);
            this = local_78;
            if (uVar13 < uVar8 && uVar13 < local_c8._M_string_length) {
              local_60 = uVar8 + 1;
              local_38 = uVar8 - 1;
              local_40 = uVar8;
              while (p_Var9 = (this->m_short_options)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_parent, p_Var9 != (_Base_ptr)0x0) {
                cVar2 = local_c8._M_dataplus._M_p[uVar13];
                p_Var12 = local_58;
                do {
                  uVar3 = (undefined1)p_Var9[1]._M_color;
                  if (cVar2 <= (char)uVar3) {
                    p_Var12 = p_Var9;
                  }
                  p_Var9 = (&p_Var9->_M_left)[(char)uVar3 < cVar2];
                } while (p_Var9 != (_Base_ptr)0x0);
                if ((p_Var12 == local_58) || (cVar2 < (char)p_Var12[1]._M_color)) goto LAB_00107529;
                local_e8 = &local_d8;
                local_e0 = 0;
                local_d8 = 0;
                if (uVar13 == local_38 && local_60 < local_c8._M_string_length) {
                  std::__cxx11::string::assign((string *)&local_e8,(ulong)&local_c8,local_60);
                }
                if (((uVar13 == local_c8._M_string_length - 1) &&
                    ((this->m_options).
                     super__Vector_base<cali::util::Args::Table,_std::allocator<cali::util::Args::Table>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)p_Var12[1]._M_parent].
                     has_argument == true)) && (uVar1 = pos + 1, (int)uVar1 < argc)) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_a8,
                             *(char **)(&local_80->_M_color + (long)(int)uVar1 * 2),&local_e9);
                  std::__cxx11::string::operator=((string *)&local_e8,(string *)local_a8);
                  pos = uVar1;
                  if (local_a8 != (undefined1  [8])local_98) {
                    operator_delete((void *)local_a8,local_98._0_8_ + 1);
                  }
                }
                local_a8 = (undefined1  [8])p_Var12[1]._M_parent;
                local_a0._M_p = local_98 + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_a0,local_e8,local_e8 + local_e0);
                std::
                _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
                ::_M_emplace_unique<std::pair<unsigned_long,std::__cxx11::string>>
                          (local_68,(pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_a8);
                if (local_a0._M_p != local_98 + 8) {
                  operator_delete(local_a0._M_p,local_98._8_8_ + 1);
                }
                if (local_e8 != &local_d8) {
                  operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
                }
                uVar13 = uVar13 + 1;
                if ((local_40 <= uVar13) || (local_c8._M_string_length <= uVar13))
                goto LAB_001075ca;
              }
              local_f0 = 1;
              pcVar11 = (char *)(ulong)(uint)pos;
            }
          }
        }
        else {
          lVar6 = std::__cxx11::string::find((char)&local_c8,0x3d);
          std::__cxx11::string::substr((ulong)local_a8,(ulong)&local_c8);
          iVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::find(&local_48->_M_t,(key_type *)local_a8);
          this = local_78;
          if (local_a8 != (undefined1  [8])local_98) {
            operator_delete((void *)local_a8,local_98._0_8_ + 1);
          }
          if (iVar7._M_node == local_50) {
LAB_00107529:
            local_f0 = 1;
            pcVar11 = (char *)(ulong)(uint)pos;
          }
          else {
            local_e8 = &local_d8;
            local_e0 = 0;
            local_d8 = 0;
            if ((lVar6 != -1) && (lVar6 + 1U < local_c8._M_string_length)) {
              std::__cxx11::string::assign((string *)&local_e8,(ulong)&local_c8,lVar6 + 1U);
            }
            p_Var9 = *(_Base_ptr *)(iVar7._M_node + 2);
            lVar6 = local_e0;
            if ((local_e0 == 0 &
                (this->m_options).
                super__Vector_base<cali::util::Args::Table,_std::allocator<cali::util::Args::Table>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)p_Var9].has_argument) == 1) {
              uVar1 = pos + 1;
              if ((int)uVar1 < argc) {
                pcVar4 = *(char **)(&local_80->_M_color + (long)(int)uVar1 * 2);
                strlen(pcVar4);
                std::__cxx11::string::_M_replace((ulong)&local_e8,0,(char *)0x0,(ulong)pcVar4);
                p_Var9 = *(_Base_ptr *)(iVar7._M_node + 2);
                lVar6 = local_e0;
                pos = uVar1;
              }
              else {
                lVar6 = 0;
              }
            }
            local_a0._M_p = local_98 + 8;
            local_a8 = (undefined1  [8])p_Var9;
            std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_e8,local_e8 + lVar6)
            ;
            std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_long_const,std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<unsigned_long,std::__cxx11::string>>
                      (local_68,(pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_a8);
            if (local_a0._M_p != local_98 + 8) {
              operator_delete(local_a0._M_p,local_98._8_8_ + 1);
            }
            if (local_e8 != &local_d8) {
              operator_delete(local_e8,CONCAT71(uStack_d7,local_d8) + 1);
            }
          }
        }
      }
LAB_001075ca:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      this_00 = local_70;
      if ((local_f0 != 0) && (local_f0 != 4)) {
        if (local_f0 != 2) {
          return (int)pcVar11;
        }
        break;
      }
      pos = pos + 1;
    } while (pos < argc);
    iVar10 = pos + 1;
    iVar5 = iVar10;
    if (iVar10 < argc) {
      __args = (_Base_ptr *)(&local_80->_M_color + (long)pos * 2);
      do {
        __args = __args + 1;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>(this_00,(char **)__args);
        iVar10 = iVar10 + 1;
        iVar5 = argc;
      } while (argc != iVar10);
    }
  }
  return iVar5;
}

Assistant:

int parse(int argc, const char* const argv[], int pos)
    {
        if (argc <= pos)
            return pos;

        m_programname = argv[0];

        int i;

        for (i = pos; i < argc; ++i) {
            std::string arg { argv[i] };

            if (arg.empty())
                continue;
            if (arg == m_options_end)
                break;

            // --- handle long options

            auto lps = m_longopt_prefix.size();

            if (!m_longopt_prefix.empty() && arg.find(m_longopt_prefix) == 0) {
                std::string::size_type dpos = arg.find('=');

                auto it = m_long_options.find(arg.substr(lps, dpos == std::string::npos ? dpos : dpos - lps));

                if (it == m_long_options.end())
                    return i;

                std::string optarg;

                if (dpos != std::string::npos && dpos + 1 < arg.size())
                    optarg.assign(arg, dpos + 1, std::string::npos);
                if (m_options[it->second].has_argument && optarg.empty() && i + 1 < argc)
                    optarg.assign(argv[++i]);

                m_active_options.insert(make_pair(it->second, optarg));

                continue;
            }

            // handle short options

            auto sps = m_shortopt_prefix.size();

            if (!m_shortopt_prefix.empty() && arg.find(m_shortopt_prefix) == 0) {
                std::string::size_type dpos = arg.find('=');

                // handle characters in the shortopt string; last one may have an option argument
                for (auto n = sps; n < arg.size() && n < dpos; ++n) {
                    auto it = m_short_options.find(arg[n]);

                    if (it == m_short_options.end())
                        return i;

                    std::string optarg;

                    if (dpos + 1 < arg.size() && n == dpos - 1)
                        optarg.assign(arg, dpos + 1, std::string::npos);
                    if (n == arg.size() - 1 && m_options[it->second].has_argument && (i + 1) < argc)
                        optarg.assign(std::string(argv[++i]));

                    m_active_options.insert(make_pair(it->second, optarg));
                }

                continue;
            }

            // this is a non-option argument
            m_arguments.emplace_back(arg);
        }

        // treat all remaining elements as arguments (i.e., not options)

        for (++i; i < argc; ++i)
            m_arguments.emplace_back(argv[i]);

        return i;
    }